

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::custom_layer_to_index(Net *this,char *type)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  char *in_RSI;
  long in_RDI;
  int i;
  int custom_layer_registry_entry_count;
  int local_20;
  
  sVar2 = std::vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>::size
                    ((vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                      *)(in_RDI + 0x58));
  local_20 = 0;
  while( true ) {
    if ((int)sVar2 <= local_20) {
      return -1;
    }
    pvVar3 = std::vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>::
             operator[]((vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                         *)(in_RDI + 0x58),(long)local_20);
    iVar1 = strcmp(in_RSI,pvVar3->name);
    if (iVar1 == 0) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

int Net::custom_layer_to_index(const char* type)
{
    const int custom_layer_registry_entry_count = custom_layer_registry.size();
    for (int i=0; i<custom_layer_registry_entry_count; i++)
    {
        if (strcmp(type, custom_layer_registry[i].name) == 0)
            return i;
    }

    return -1;
}